

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

RestUnitSearchInfo *
allocate_search_structs(AV1_COMMON *cm,RestorationInfo *rsi,int is_uv,int min_luma_unit_size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  RestUnitSearchInfo *__s;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  AV1_COMMON *in_RDI;
  RestUnitSearchInfo *rusi;
  int max_num_units;
  int max_vert_units;
  int max_horz_units;
  int plane_h;
  int plane_w;
  int min_unit_size;
  int s;
  void *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  av1_get_upsampled_plane_size
            (in_RDI,in_EDX,(int *)&stack0xffffffffffffffdc,(int *)&stack0xffffffffffffffd8);
  iVar1 = av1_lr_count_units(in_ECX,in_stack_ffffffffffffffdc);
  iVar2 = av1_lr_count_units(in_ECX,in_stack_ffffffffffffffd8);
  iVar3 = iVar1 * iVar2;
  aom_free(in_stack_ffffffffffffffc0);
  pvVar4 = aom_memalign(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        CONCAT44(iVar1,iVar2));
  *(void **)(in_RSI + 0x18) = pvVar4;
  if (*(long *)(in_RSI + 0x18) == 0) {
    aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,"Failed to allocate rsi->unit_info");
  }
  __s = (RestUnitSearchInfo *)
        aom_memalign(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     CONCAT44(iVar1,iVar2));
  if (__s == (RestUnitSearchInfo *)0x0) {
    aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,"Failed to allocate rusi");
  }
  memset(__s,0,(long)iVar3 << 6);
  return __s;
}

Assistant:

static RestUnitSearchInfo *allocate_search_structs(AV1_COMMON *cm,
                                                   RestorationInfo *rsi,
                                                   int is_uv,
                                                   int min_luma_unit_size) {
#if COUPLED_CHROMA_FROM_LUMA_RESTORATION
  int sx = cm->seq_params.subsampling_x;
  int sy = cm->seq_params.subsampling_y;
  int s = (p > 0) ? AOMMIN(sx, sy) : 0;
#else
  int s = 0;
#endif  // !COUPLED_CHROMA_FROM_LUMA_RESTORATION
  int min_unit_size = min_luma_unit_size >> s;

  int plane_w, plane_h;
  av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);

  const int max_horz_units = av1_lr_count_units(min_unit_size, plane_w);
  const int max_vert_units = av1_lr_count_units(min_unit_size, plane_h);
  const int max_num_units = max_horz_units * max_vert_units;

  aom_free(rsi->unit_info);
  CHECK_MEM_ERROR(cm, rsi->unit_info,
                  (RestorationUnitInfo *)aom_memalign(
                      16, sizeof(*rsi->unit_info) * max_num_units));

  RestUnitSearchInfo *rusi;
  CHECK_MEM_ERROR(
      cm, rusi,
      (RestUnitSearchInfo *)aom_memalign(16, sizeof(*rusi) * max_num_units));

  // If the restoration unit dimensions are not multiples of
  // rsi->restoration_unit_size then some elements of the rusi array may be
  // left uninitialised when we reach copy_unit_info(...). This is not a
  // problem, as these elements are ignored later, but in order to quiet
  // Valgrind's warnings we initialise the array below.
  memset(rusi, 0, sizeof(*rusi) * max_num_units);

  return rusi;
}